

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OCVWarp.cpp
# Opt level: O2

void writeIni(string *iniwpath)

{
  ostream *poVar1;
  ofstream inifileout;
  
  std::ofstream::ofstream(&inifileout,(string *)iniwpath,_S_out);
  poVar1 = std::operator<<((ostream *)&inifileout,"#ini_file_for_OCVWarp--Comments_start_with_#");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&inifileout,
                           "#Enter_each_parameter_in_the_line_below_the_comment. ");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&inifileout,"#AngleXinDegrees_float");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&inifileout,anglexstr);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&inifileout,"#AngleXIncrementperFrameinDegrees_float");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&inifileout,anglexincrstr);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&inifileout,"#AngleYinDegrees_float");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&inifileout,angleystr);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&inifileout,"#AngleYIncrementperFrameinDegrees_float");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&inifileout,angleyincrstr);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&inifileout,"#Output_width_pixels");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)&inifileout,outputw);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&inifileout,"#Output_height_pixels");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)&inifileout,outputh);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&inifileout,
                           "#0=360Fisheye_1=180Fisheye_etc--see_transformtype.txt");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)&inifileout,transformtype);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&inifileout,
                           "#Output_video_codec_fourcc__use_NULL_for_same_as_input--see_fourcc.txt")
  ;
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&inifileout,outputfourccstr);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&inifileout,"#Path_to_Map_file_used_for_transformtype_4_&_5");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&inifileout,"EP_xyuv_1920.map");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&inifileout,"#Output_fps_-1=same_as_input__0=image_sequence");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&inifileout,outputfpsstr);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::ofstream::~ofstream(&inifileout);
  return;
}

Assistant:

inline void writeIni(std::string iniwpath) 
{
	try {
		std::ofstream inifileout(iniwpath);
		inifileout << "#ini_file_for_OCVWarp--Comments_start_with_#" << std::endl;
		inifileout << "#Enter_each_parameter_in_the_line_below_the_comment. " << std::endl;
		inifileout << "#AngleXinDegrees_float" << std::endl;
		inifileout << anglexstr << std::endl;
		inifileout << "#AngleXIncrementperFrameinDegrees_float" << std::endl;
		inifileout << anglexincrstr << std::endl;
		inifileout << "#AngleYinDegrees_float" << std::endl;
		inifileout << angleystr << std::endl;
		inifileout << "#AngleYIncrementperFrameinDegrees_float" << std::endl;
		inifileout << angleyincrstr << std::endl;
		inifileout << "#Output_width_pixels" << std::endl;
		inifileout << outputw << std::endl;
		inifileout << "#Output_height_pixels" << std::endl;
		inifileout << outputh << std::endl;
		inifileout << "#0=360Fisheye_1=180Fisheye_etc--see_transformtype.txt" << std::endl;
		inifileout << transformtype << std::endl;
		inifileout << "#Output_video_codec_fourcc__use_NULL_for_same_as_input--see_fourcc.txt" << std::endl;
		inifileout << outputfourccstr << std::endl;		
		inifileout << "#Path_to_Map_file_used_for_transformtype_4_&_5" << std::endl;
		inifileout << "EP_xyuv_1920.map" << std::endl;
		inifileout << "#Output_fps_-1=same_as_input__0=image_sequence" << std::endl;
		inifileout << outputfpsstr << std::endl;
		
	} catch (int) {
		std::cerr << "An error occured writing to ini file."<< std::endl ; 		
	}
}